

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.cpp
# Opt level: O2

TerminalSize duckdb::Terminal::TryMeasureTerminalSize(void)

{
  TerminalSize TVar1;
  ssize_t sVar2;
  TerminalSize TVar3;
  size_t __n;
  ulong uVar4;
  ulong uVar5;
  char seq [32];
  
  TVar1 = GetCursorPosition();
  if (TVar1.ws_col == 0) {
LAB_001f357c:
    uVar4 = 0;
  }
  else {
    sVar2 = ::write(1,"\x1b[999;999f",10);
    if (sVar2 != 10) goto LAB_001f357c;
    TVar3 = GetCursorPosition();
    uVar4 = (ulong)TVar3 >> 0x20;
    uVar5 = (ulong)TVar3 & 0xffffffff;
    if (uVar5 != 0) {
      snprintf(seq,0x20,"\x1b[%d;%df",(ulong)TVar1 >> 0x20,(ulong)TVar1 & 0xffffffff);
      __n = strlen(seq);
      ::write(1,seq,__n);
      goto LAB_001f3581;
    }
  }
  uVar5 = 0;
LAB_001f3581:
  return (TerminalSize)(uVar4 << 0x20 | uVar5);
}

Assistant:

TerminalSize Terminal::TryMeasureTerminalSize() {
	int ofd = STDOUT_FILENO;
	/* ioctl() failed. Try to query the terminal itself. */
	TerminalSize start, result;

	/* Get the initial position so we can restore it later. */
	start = GetCursorPosition();
	if (!start.ws_col) {
		return result;
	}

	/* Go to bottom-right margin */
	if (write(ofd, "\x1b[999;999f", 10) != 10) {
		return result;
	}
	result = GetCursorPosition();
	if (!result.ws_col) {
		return result;
	}

	/* Restore position. */
	char seq[32];
	snprintf(seq, 32, "\x1b[%d;%df", start.ws_row, start.ws_col);
	if (write(ofd, seq, strlen(seq)) == -1) {
		/* Can't recover... */
	}
	return result;
}